

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timestep_embedding.cpp
# Opt level: O2

void set_timestep_embedding(ggml_tensor *timesteps,ggml_tensor *embedding,int dim,int max_period)

{
  int iVar1;
  ulong uVar2;
  int j;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  __type _Var6;
  double dVar7;
  allocator_type local_5d;
  uint local_5c;
  double local_58;
  long local_50;
  vector<float,_std::allocator<float>_> freqs;
  
  iVar1 = (int)((long)dim / 2);
  local_5c = dim;
  std::vector<float,_std::allocator<float>_>::vector(&freqs,(long)iVar1,&local_5d);
  local_58 = (double)iVar1;
  uVar2 = 0;
  uVar4 = (long)dim / 2 & 0xffffffff;
  if (iVar1 < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    _Var6 = std::log<int>(max_period);
    dVar7 = exp((-_Var6 * (double)(int)uVar2) / local_58);
    freqs.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [uVar2] = (float)dVar7;
  }
  local_50 = (long)(int)local_5c;
  for (uVar2 = 0; (long)uVar2 < timesteps->ne[0]; uVar2 = uVar2 + 1) {
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      fVar5 = (float)ggml_get_f32_1d(timesteps,uVar2 & 0xffffffff);
      local_58 = (double)CONCAT44(local_58._4_4_,
                                  fVar5 * freqs.super__Vector_base<float,_std::allocator<float>_>.
                                          _M_impl.super__Vector_impl_data._M_start[uVar3]);
      fVar5 = cosf(fVar5 * freqs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar3]);
      ggml_tensor_set_f32(embedding,fVar5,(int)uVar3,(int)uVar2,0,0);
      fVar5 = sinf(local_58._0_4_);
      ggml_tensor_set_f32(embedding,fVar5,iVar1 + (int)uVar3,(int)uVar2,0,0);
    }
    if ((local_5c & 1) != 0) {
      *(undefined4 *)
       ((long)embedding->data + embedding->nb[0] * local_50 + embedding->nb[1] * uVar2) = 0;
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&freqs.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void set_timestep_embedding(struct ggml_tensor* timesteps, struct ggml_tensor* embedding, int dim, int max_period = 10000) {
    // timesteps: [N,]
    // embedding: [dim, N]
    int half = dim / 2;
    std::vector<float> freqs(half);
    for (int i = 0; i < half; ++i) {
        freqs[i] = (float)std::exp(-std::log(max_period) * i / half);
    }
    for (int i = 0; i < timesteps->ne[0]; ++i) {
        for (int j = 0; j < half; ++j) {
            float arg = ggml_get_f32_1d(timesteps, i) * freqs[j];
            ggml_tensor_set_f32(embedding, std::cos(arg), j, i);
            ggml_tensor_set_f32(embedding, std::sin(arg), j + half, i);
        }
        if (dim % 2 != 0) {
            *(float*)((char*)embedding->data + i * embedding->nb[1] + dim * embedding->nb[0]) = 0;
        }
    }
}